

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

Ref cashew::ValueBuilder::makeConditional(Ref condition,Ref ifTrue,Ref ifFalse)

{
  char *pcVar1;
  Value *pVVar2;
  Ref RVar3;
  void *__ptr;
  
  pVVar2 = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  pVVar2->type = Null;
  pVVar2 = cashew::Value::setArray(pVVar2,4);
  __ptr = (void *)0x18;
  RVar3.inst = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  (RVar3.inst)->type = Null;
  cashew::Value::free(RVar3.inst,__ptr);
  (RVar3.inst)->type = String;
  pcVar1 = DAT_010b12a0;
  ((RVar3.inst)->field_1).str.str._M_len = CONDITIONAL;
  ((RVar3.inst)->field_1).str.str._M_str = pcVar1;
  pVVar2 = cashew::Value::push_back(pVVar2,RVar3);
  pVVar2 = cashew::Value::push_back(pVVar2,condition);
  pVVar2 = cashew::Value::push_back(pVVar2,ifTrue);
  RVar3.inst = cashew::Value::push_back(pVVar2,ifFalse);
  return (Ref)RVar3.inst;
}

Assistant:

static Ref makeConditional(Ref condition, Ref ifTrue, Ref ifFalse) {
    return &makeRawArray(4)
              ->push_back(makeRawString(CONDITIONAL))
              .push_back(condition)
              .push_back(ifTrue)
              .push_back(ifFalse);
  }